

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

double __thiscall
soplex::SPxSolverBase<double>::coTest(SPxSolverBase<double> *this,int i,Status stat)

{
  pointer pdVar1;
  double dVar2;
  double dVar3;
  
  switch(stat) {
  case D_FREE:
  case D_ON_BOTH:
    dVar3 = (this->theCoPvec->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
    dVar2 = dVar3 - (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[i];
    if (dVar2 < 0.0) {
      return dVar2;
    }
    goto LAB_001cea41;
  case D_ON_UPPER:
    dVar3 = (this->theCoPvec->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
    pdVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    break;
  case D_ON_LOWER:
    dVar3 = (this->theCoPvec->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
LAB_001cea41:
    return (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[i] - dVar3;
  case P_ON_LOWER:
    return (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[i] -
           (this->theCoPvec->super_VectorBase<double>).val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[i];
  default:
    return 0.0;
  case P_ON_UPPER:
    dVar3 = (this->theCoPvec->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
    pdVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  }
  return dVar3 - pdVar1[i];
}

Assistant:

R SPxSolverBase<R>::coTest(int i, typename SPxBasisBase<R>::Desc::Status stat) const
{
   assert(type() == ENTER);
   assert(!isBasic(stat));

   R x;

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_BOTH :
      assert(rep() == ROW);
      x = (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

      if(x < 0)
         return x;

   // no break: next is else case
   //lint -fallthrough
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
      assert(rep() == ROW);
      return SPxLPBase<R>::upper(i) - (*theCoPvec)[i];

   case SPxBasisBase<R>::Desc::D_ON_UPPER:
      assert(rep() == ROW);
      return (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      assert(rep() == COLUMN);
      return (*theCoPvec)[i] - this->maxRowObj(i);             // slacks !

   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      assert(rep() == COLUMN);
      return this->maxRowObj(i) - (*theCoPvec)[i];             // slacks !

   default:
      return 0;
   }
}